

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::generateSingleProgramData
          (ProgramContext *__return_storage_ptr__,FunctionCase *this,ProgramID programID)

{
  pointer pAVar1;
  ulong uVar2;
  DataType *pDVar3;
  char *__s;
  FunctionCase *pFVar4;
  int iVar5;
  int iVar6;
  DataType DVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  undefined8 *puVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  ulong *puVar16;
  long lVar17;
  uint uVar18;
  ostringstream *poVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  char cVar25;
  int i;
  string *this_00;
  int iVar26;
  ostringstream *this_01;
  string incExpr;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  string inputName;
  string returnPrecisionMaybe;
  string swizzle;
  char *paramTypeNames [3];
  string paramPrecisionsMaybe [3];
  ostringstream vtx;
  ostringstream frag;
  char *local_788;
  string local_780;
  char local_759;
  string local_758;
  FunctionCase *local_738;
  ostringstream *local_730;
  CaseType local_728;
  uint local_724;
  ulong local_720;
  undefined1 local_718 [24];
  long lStack_700;
  char *local_6f0;
  long local_6e8;
  AttribSpec local_6e0;
  char *local_680;
  ProgramID local_674;
  Vec4 local_670;
  ulong local_660;
  long lStack_658;
  char *local_650;
  Vec4 local_648;
  ulong local_638 [2];
  Vec4 local_628;
  undefined1 local_618;
  undefined7 uStack_617;
  long *local_608;
  long local_600;
  long local_5f8;
  long lStack_5f0;
  long *local_5e8;
  long local_5e0;
  long local_5d8;
  long lStack_5d0;
  ProgramContext *local_5c8;
  long *local_5c0;
  long local_5b8;
  long local_5b0;
  long lStack_5a8;
  char *local_5a0;
  undefined8 local_598;
  char local_590;
  undefined7 uStack_58f;
  undefined1 local_580 [8];
  undefined8 local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570 [6];
  ios_base local_510 [264];
  undefined1 *local_408;
  undefined8 local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8;
  undefined7 uStack_3b7;
  undefined8 auStack_3a8 [4];
  string local_388 [8];
  string local_380 [8];
  string local_378 [48];
  long local_348 [5];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  local_728 = (this->super_OperatorPerformanceCase).m_caseType;
  local_674 = programID;
  local_5c8 = __return_storage_ptr__;
  pcVar8 = glu::getPrecisionName(this->m_precision);
  local_6f0 = glu::getDataTypeName(this->m_returnType);
  uVar18 = this->m_returnType - TYPE_BOOL;
  local_738 = this;
  local_650 = pcVar8;
  if (uVar18 < 4) {
    local_608 = &local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,0x1b32ab9);
  }
  else {
    local_3c8 = &local_3b8;
    local_3c0 = 0;
    local_3b8 = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_3c8);
    local_3e8 = &local_3d8;
    plVar13 = plVar11 + 2;
    if ((long *)*plVar11 == plVar13) {
      local_3d8 = *plVar13;
      lStack_3d0 = plVar11[3];
    }
    else {
      local_3d8 = *plVar13;
      local_3e8 = (long *)*plVar11;
    }
    local_3e0 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_608 = &local_5f8;
    plVar13 = plVar11 + 2;
    if ((long *)*plVar11 == plVar13) {
      local_5f8 = *plVar13;
      lStack_5f0 = plVar11[3];
    }
    else {
      local_5f8 = *plVar13;
      local_608 = (long *)*plVar11;
    }
    local_600 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
  }
  if (3 < uVar18) {
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
    }
  }
  DVar7 = local_738->m_returnType;
  lVar17 = 0x10;
  do {
    *(string **)((long)auStack_3a8 + lVar17 + 0x10) = local_388 + lVar17;
    *(undefined8 *)((long)auStack_3a8 + lVar17 + 0x18) = 0;
    local_388[lVar17] = (string)0x0;
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x70);
  local_759 = DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9;
  local_788 = &local_590;
  this_00 = local_388;
  uVar22 = 0;
  local_720 = 0;
  local_730 = (ostringstream *)0x0;
  do {
    pFVar4 = local_738;
    pcVar8 = glu::getDataTypeName(local_738->m_paramTypes[uVar22]);
    auStack_3a8[uVar22] = pcVar8;
    uVar18 = pFVar4->m_paramTypes[uVar22] - TYPE_BOOL;
    if (uVar18 < 4) {
      local_580 = (undefined1  [8])local_570;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_580,0x1b32ab9);
    }
    else {
      local_5a0 = &local_590;
      local_598 = 0;
      local_590 = '\0';
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_5a0);
      local_5c0 = &local_5b0;
      plVar13 = plVar11 + 2;
      if ((long *)*plVar11 == plVar13) {
        local_5b0 = *plVar13;
        lStack_5a8 = plVar11[3];
      }
      else {
        local_5b0 = *plVar13;
        local_5c0 = (long *)*plVar11;
      }
      local_5b8 = plVar11[1];
      *plVar11 = (long)plVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_5c0);
      local_580 = (undefined1  [8])local_570;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar14) {
        local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_570[0]._8_8_ = plVar11[3];
      }
      else {
        local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_580 = (undefined1  [8])*plVar11;
      }
      local_578 = plVar11[1];
      *plVar11 = (long)paVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
    }
    std::__cxx11::string::operator=(this_00,(string *)local_580);
    if (local_580 != (undefined1  [8])local_570) {
      operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
    }
    if (3 < uVar18) {
      if (local_5c0 != &local_5b0) {
        operator_delete(local_5c0,local_5b0 + 1);
      }
      if (local_5a0 != &local_590) {
        operator_delete(local_5a0,CONCAT71(uStack_58f,local_590) + 1);
      }
    }
    if (local_730 == (ostringstream *)0x0) {
      local_730 = (ostringstream *)0x0;
      if (local_738->m_precision == PRECISION_LOWP) {
        local_730 = (ostringstream *)0x1c00dfd;
      }
      if (3 < local_738->m_paramTypes[uVar22] - TYPE_INT) {
        local_730 = (ostringstream *)0x0;
      }
    }
    pDVar3 = local_738->m_paramTypes + uVar22;
    uVar22 = uVar22 + 1;
    if (*pDVar3 != TYPE_INVALID) {
      local_720 = uVar22;
    }
    local_720 = local_720 & 0xffffffff;
    this_00 = this_00 + 0x20;
  } while (uVar22 != 3);
  poVar19 = local_730;
  if (local_730 == (ostringstream *)0x0) {
    poVar19 = (ostringstream *)local_650;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  this_01 = (ostringstream *)local_1a8;
  if (local_728 == CASETYPE_VERTEX) {
    this_01 = (ostringstream *)local_320;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (location = 0) out mediump vec4 o_color;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  local_724 = (int)local_720 + 3;
  if (0 < (int)local_724) {
    uVar18 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
      if (poVar19 == (ostringstream *)0x0) {
        std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x468);
      }
      else {
        sVar9 = strlen((char *)poVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)poVar19,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 a_in",10);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      uVar18 = uVar18 + 1;
    } while (local_724 != uVar18);
  }
  if (local_728 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in mediump vec4 v_color;\n",0x19);
  }
  else if (0 < (int)local_724) {
    uVar18 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
      if (poVar19 == (ostringstream *)0x0) {
        std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x468);
      }
      else {
        sVar9 = strlen((char *)poVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)poVar19,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 v_in",10);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      if (poVar19 == (ostringstream *)0x0) {
        std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x5e0);
      }
      else {
        sVar9 = strlen((char *)poVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)poVar19,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," vec4 v_in",10);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      uVar18 = uVar18 + 1;
    } while (local_724 != uVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"uniform mediump int u_numLoopIterations;\n",0x29);
  if (local_728 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"uniform mediump float u_zero;\n",0x1e);
  }
  local_680 = (char *)(local_720 & 0xffffffff);
  if (0 < (int)local_720) {
    lVar17 = (long)local_680 * 8;
    cVar25 = 'A';
    lVar20 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"uniform ",8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,*(char **)(local_388 + lVar20 * 4),
                           *(long *)(local_378 + lVar20 * 4 + -8));
      pcVar8 = *(char **)((long)auStack_3a8 + lVar20);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," u_inc",6);
      local_580[0] = cVar25;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_580,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      cVar25 = cVar25 + '\x01';
      lVar20 = lVar20 + 8;
    } while (lVar17 - lVar20 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  if (local_728 != CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  local_788 = "v_";
  if (local_728 == CASETYPE_VERTEX) {
    local_788 = "a_";
  }
  local_6e8 = 0;
  pcVar8 = local_6f0;
  local_730 = this_01;
  do {
    if (0 < (int)local_720) {
      pcVar21 = (char *)0x0;
      do {
        DVar7 = local_738->m_paramTypes[(long)pcVar21];
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,*(char **)(local_388 + (long)pcVar21 * 0x20),
                             *(long *)(local_378 + (long)pcVar21 * 0x20 + -8));
        __s = (char *)auStack_3a8[(long)pcVar21];
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
        }
        else {
          sVar9 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," in",3);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_6e8);
        local_580[0] = (char)pcVar21 + 'a';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_580,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        if (DVar7 != TYPE_FLOAT_VEC4) {
          if (__s == (char *)0x0) {
            std::ios::clear((int)this_01 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
          }
          else {
            sVar9 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,__s,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(",1);
        }
        if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
          iVar5 = glu::getDataTypeMatrixNumRows(DVar7);
          iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
          if (iVar5 < 4) {
            local_408 = &local_3f8;
            local_400 = 0;
            local_3f8 = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_408);
            local_5e8 = &local_5d8;
            plVar13 = plVar11 + 2;
            if ((long *)*plVar11 == plVar13) {
              local_5d8 = *plVar13;
              lStack_5d0 = plVar11[3];
            }
            else {
              local_5d8 = *plVar13;
              local_5e8 = (long *)*plVar11;
            }
            local_5e0 = plVar11[1];
            *plVar11 = (long)plVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_5e8);
            local_580 = (undefined1  [8])local_570;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 == paVar14) {
              local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
              local_570[0]._8_8_ = puVar12[3];
            }
            else {
              local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
              local_580 = (undefined1  [8])*puVar12;
            }
            local_578 = puVar12[1];
            *puVar12 = paVar14;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
          }
          else {
            local_580 = (undefined1  [8])local_570;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_580,0x1b32ab9);
          }
          if (iVar5 < 4) {
            if (local_5e8 != &local_5d8) {
              operator_delete(local_5e8,local_5d8 + 1);
            }
            if (local_408 != &local_3f8) {
              operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
            }
          }
          if (0 < iVar6) {
            iVar5 = (int)local_6e8;
            iVar26 = 0;
            do {
              poVar19 = local_730;
              pcVar8 = " , ";
              if (iVar26 == 0) {
                pcVar8 = glcts::fixed_sample_locations_values;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_730,(bool *)pcVar8 + 1,(ulong)((uint)(iVar26 != 0) * 2));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,local_788,2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,"in",2);
              poVar10 = (ostream *)std::ostream::operator<<(poVar19,iVar5 + (int)pcVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_580,local_578);
              iVar26 = iVar26 + 1;
            } while (iVar6 != iVar26);
          }
          pcVar8 = local_6f0;
          this_01 = local_730;
          if (local_580 != (undefined1  [8])local_570) {
            operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
            pcVar8 = local_6f0;
            this_01 = local_730;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_788,2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"in",2);
          std::ostream::operator<<(this_01,(int)local_6e8 + (int)pcVar21);
          if (pcVar21 == (char *)(ulong)(uint)local_738->m_modifyParamNdx) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," + 2.0",6);
          }
        }
        if (DVar7 != TYPE_FLOAT_VEC4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
        pcVar21 = pcVar21 + 1;
      } while (pcVar21 != local_680);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01,(char *)local_608,local_600);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," res",4);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_6e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(0);\n",5);
    local_6e8 = local_6e8 + 1;
  } while (local_6e8 != 4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"\tfor (int i = 0; i < u_numLoopIterations; i++)\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t{\n",3);
  pcVar8 = (char *)0x0;
  do {
    local_788 = pcVar8;
    if ((int)pcVar8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t\t{\n",4);
    if (0 < (int)local_720) {
      pcVar8 = (char *)0x0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        std::ostream::operator<<((string *)local_580,(int)local_788);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_758,0,(char *)0x0,0x1c7e163);
        local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_780.field_2._M_allocated_capacity = *psVar15;
          local_780.field_2._8_8_ = plVar11[3];
        }
        else {
          local_780.field_2._M_allocated_capacity = *psVar15;
          local_780._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_780._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)&local_780,local_780._M_string_length,0,'\x01');
        local_6e0.name._M_dataplus._M_p = (pointer)&local_6e0.name.field_2;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_6e0.name.field_2._M_allocated_capacity = *psVar15;
          local_6e0.name.field_2._8_8_ = plVar11[3];
        }
        else {
          local_6e0.name.field_2._M_allocated_capacity = *psVar15;
          local_6e0.name._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_6e0.name._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_dataplus._M_p != &local_780.field_2) {
          operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
        local_758._M_string_length = 0;
        local_758.field_2._M_allocated_capacity =
             local_758.field_2._M_allocated_capacity & 0xffffffffffffff00;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_758);
        local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
        puVar16 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_780.field_2._M_allocated_capacity = *puVar16;
          local_780.field_2._8_8_ = plVar11[3];
        }
        else {
          local_780.field_2._M_allocated_capacity = *puVar16;
          local_780._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_780._M_string_length = plVar11[1];
        *plVar11 = (long)puVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_replace_aux
                            ((ulong)&local_780,local_780._M_string_length,0,'\x01');
        local_580 = (undefined1  [8])local_570;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar14) {
          local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
          local_570[0]._8_8_ = puVar12[3];
        }
        else {
          local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
          local_580 = (undefined1  [8])*puVar12;
        }
        local_578 = puVar12[1];
        *puVar12 = paVar14;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_dataplus._M_p != &local_780.field_2) {
          operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        incrementExpr(&local_780,(string *)local_580,local_738->m_paramTypes[(long)pcVar8],
                      local_738->m_useNearlyConstantInputs);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t\t\t",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,local_6e0.name._M_dataplus._M_p,
                             local_6e0.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        sumExpr(&local_758,&local_6e0.name,&local_780,local_738->m_paramTypes[(long)pcVar8]);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_758._M_dataplus._M_p,local_758._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_dataplus._M_p != &local_780.field_2) {
          operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
        }
        if (local_580 != (undefined1  [8])local_570) {
          operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
          operator_delete(local_6e0.name._M_dataplus._M_p,
                          local_6e0.name.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = pcVar8 + 1;
      } while (local_680 != pcVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t\t\t",3);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01,(char *)local_608,local_600);
    pcVar8 = local_6f0;
    if (local_6f0 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
    }
    else {
      sVar9 = strlen(local_6f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," eval",5);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_788);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    pcVar8 = local_6f0;
    if (local_674 == PROGRAM_WITH_FUNCTION_CALLS) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,(local_738->m_func)._M_dataplus._M_p,
                           (local_738->m_func)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      lVar17 = 1;
      if ((int)local_720 < 1) {
        pcVar8 = ")";
      }
      else {
        iVar5 = 0;
        do {
          if (iVar5 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_730,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_730,"in",2);
          poVar10 = (ostream *)std::ostream::operator<<(local_730,(int)local_788);
          local_580[0] = (char)iVar5 + 'a';
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_580,1);
          iVar5 = iVar5 + 1;
        } while ((int)local_720 != iVar5);
        pcVar8 = ")";
        this_01 = local_730;
      }
    }
    else if (local_6f0 == (char *)0x0) {
      lVar17 = 3;
      std::ios::clear((int)this_01 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
      pcVar8 = "(1)";
    }
    else {
      sVar9 = strlen(local_6f0);
      lVar17 = 3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar8,sVar9);
      pcVar8 = "(1)";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar8,lVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::ostream::operator<<((string *)local_580,(int)local_788);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_780,0,(char *)0x0,0x1c1cadd);
    local_6e0.name._M_dataplus._M_p = (pointer)&local_6e0.name.field_2;
    psVar15 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_6e0.name.field_2._M_allocated_capacity = *psVar15;
      local_6e0.name.field_2._8_8_ = plVar11[3];
    }
    else {
      local_6e0.name.field_2._M_allocated_capacity = *psVar15;
      local_6e0.name._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_6e0.name._M_string_length = plVar11[1];
    *plVar11 = (long)psVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::ostream::operator<<((string *)local_580,(int)local_788);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_758,0,(char *)0x0,0x1c1cad5);
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_780.field_2._M_allocated_capacity = *puVar16;
      local_780.field_2._8_8_ = plVar11[3];
    }
    else {
      local_780.field_2._M_allocated_capacity = *puVar16;
      local_780._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_780._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    incrementExpr((string *)local_580,&local_780,local_738->m_returnType,
                  local_738->m_useNearlyConstantInputs);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t\t\tres",6);
    poVar10 = (ostream *)std::ostream::operator<<(this_01,(int)local_788);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
    sumExpr(&local_758,&local_6e0.name,(string *)local_580,local_738->m_returnType);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_758._M_dataplus._M_p,local_758._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    if (local_580 != (undefined1  [8])local_570) {
      operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
      operator_delete(local_6e0.name._M_dataplus._M_p,
                      local_6e0.name.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t\t}\n",4);
    uVar18 = (int)local_788 + 1;
    pcVar8 = (char *)(ulong)uVar18;
  } while (uVar18 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
  if (0 < (int)local_720) {
    local_788 = (char *)0x0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,*(char **)(local_388 + (long)local_788 * 0x20),
                           *(long *)(local_378 + (long)local_788 * 0x20 + -8));
      pcVar8 = (char *)auStack_3a8[(long)local_788];
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," sumIn",6);
      local_580[0] = (char)local_788 + 'A';
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_580,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
      local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
      local_780._M_string_length = 0;
      local_780.field_2._M_allocated_capacity =
           local_780.field_2._M_allocated_capacity & 0xffffffffffffff00;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_780);
      local_580 = (undefined1  [8])local_570;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 == paVar14) {
        local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_570[0]._8_8_ = puVar12[3];
      }
      else {
        local_570[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_580 = (undefined1  [8])*puVar12;
      }
      local_578 = puVar12[1];
      *puVar12 = paVar14;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_580,local_578,0,'\x01');
      local_6e0.name._M_dataplus._M_p = (pointer)&local_6e0.name.field_2;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_6e0.name.field_2._M_allocated_capacity = *psVar15;
        local_6e0.name.field_2._8_8_ = plVar11[3];
      }
      else {
        local_6e0.name.field_2._M_allocated_capacity = *psVar15;
        local_6e0.name._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_6e0.name._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if (local_580 != (undefined1  [8])local_570) {
        operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_dataplus._M_p != &local_780.field_2) {
        operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
      }
      iVar5 = 1;
      do {
        local_628.m_data._0_8_ = &local_618;
        local_628.m_data[2] = 0.0;
        local_628.m_data[3] = 0.0;
        local_618 = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_628);
        puVar16 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar16) {
          local_660 = *puVar16;
          lStack_658 = plVar11[3];
          local_670.m_data._0_8_ = &local_660;
        }
        else {
          local_660 = *puVar16;
          local_670.m_data._0_8_ = (ulong *)*plVar11;
        }
        local_670.m_data._8_8_ = plVar11[1];
        *plVar11 = (long)puVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
        std::ostream::operator<<((ostringstream *)local_580,iVar5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
        std::ios_base::~ios_base(local_510);
        uVar22 = 0xf;
        if ((ulong *)local_670.m_data._0_8_ != &local_660) {
          uVar22 = local_660;
        }
        uVar2 = CONCAT44(local_648.m_data[3],local_648.m_data[2]) + local_670.m_data._8_8_;
        if (uVar22 < uVar2) {
          uVar22 = 0xf;
          if ((ulong *)CONCAT44(local_648.m_data[1],local_648.m_data[0]) != local_638) {
            uVar22 = local_638[0];
          }
          if (uVar22 < uVar2) goto LAB_013998ba;
          plVar11 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_648,0,(char *)0x0,local_670.m_data._0_8_);
        }
        else {
LAB_013998ba:
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_670,
                                       CONCAT44(local_648.m_data[1],local_648.m_data[0]));
        }
        local_718._0_8_ = local_718 + 0x10;
        pAVar1 = (pointer)(plVar11 + 2);
        if ((pointer)*plVar11 == pAVar1) {
          local_718._16_8_ = (pAVar1->name)._M_dataplus._M_p;
          lStack_700 = plVar11[3];
        }
        else {
          local_718._16_8_ = (pAVar1->name)._M_dataplus._M_p;
          local_718._0_8_ = (pointer)*plVar11;
        }
        local_718._8_8_ = plVar11[1];
        *plVar11 = (long)pAVar1;
        plVar11[1] = 0;
        *(undefined1 *)&(pAVar1->name)._M_dataplus._M_p = 0;
        plVar11 = (long *)std::__cxx11::string::_M_replace_aux
                                    ((ulong)local_718,local_718._8_8_,0,'\x01');
        local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
        puVar16 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_758.field_2._M_allocated_capacity = *puVar16;
          local_758.field_2._8_8_ = plVar11[3];
        }
        else {
          local_758.field_2._M_allocated_capacity = *puVar16;
          local_758._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_758._M_string_length = plVar11[1];
        *plVar11 = (long)puVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        sumExpr(&local_780,&local_6e0.name,&local_758,local_738->m_paramTypes[(long)local_788]);
        std::__cxx11::string::operator=((string *)&local_6e0,(string *)&local_780);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_dataplus._M_p != &local_780.field_2) {
          operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_718._0_8_ != (pointer)(local_718 + 0x10)) {
          operator_delete((void *)local_718._0_8_,
                          (ulong)((long)&(((string *)local_718._16_8_)->_M_dataplus)._M_p + 1));
        }
        if ((ulong *)CONCAT44(local_648.m_data[1],local_648.m_data[0]) != local_638) {
          operator_delete((ulong *)CONCAT44(local_648.m_data[1],local_648.m_data[0]),
                          local_638[0] + 1);
        }
        if ((ulong *)local_670.m_data._0_8_ != &local_660) {
          operator_delete((void *)local_670.m_data._0_8_,local_660 + 1);
        }
        if ((undefined1 *)local_628.m_data._0_8_ != &local_618) {
          operator_delete((void *)local_628.m_data._0_8_,CONCAT71(uStack_617,local_618) + 1);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_6e0.name._M_dataplus._M_p,local_6e0.name._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
        operator_delete(local_6e0.name._M_dataplus._M_p,
                        local_6e0.name.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
      local_788 = local_788 + 1;
    } while (local_788 != local_680);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,(char *)local_608,local_600);
  pcVar8 = local_6f0;
  if (local_6f0 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(local_6f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," sumRes = ",10);
  local_6e0.name._M_dataplus._M_p = (pointer)&local_6e0.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"res0","");
  iVar5 = 1;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    std::ostream::operator<<((ostringstream *)local_580,iVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    std::ios_base::~ios_base(local_510);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_718,0,(char *)0x0,0x1c1cadd);
    local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_758.field_2._M_allocated_capacity = *puVar16;
      local_758.field_2._8_8_ = plVar11[3];
    }
    else {
      local_758.field_2._M_allocated_capacity = *puVar16;
      local_758._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_758._M_string_length = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    sumExpr(&local_780,&local_6e0.name,&local_758,local_738->m_returnType);
    std::__cxx11::string::operator=((string *)&local_6e0,(string *)&local_780);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_718._0_8_ != (pointer)(local_718 + 0x10)) {
      operator_delete((void *)local_718._0_8_,
                      (ulong)((long)&(((string *)local_718._16_8_)->_M_dataplus)._M_p + 1));
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,local_6e0.name._M_dataplus._M_p,local_6e0.name._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
    operator_delete(local_6e0.name._M_dataplus._M_p,local_6e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  DVar7 = local_738->m_returnType;
  iVar5 = (int)this_01;
  if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
    pcVar8 = local_650;
    if (local_650 == (char *)0x0) {
      std::ios::clear(iVar5 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar9 = strlen(local_650);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
    pcVar8 = local_6f0;
    if (local_6f0 == (char *)0x0) {
      std::ios::clear(iVar5 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar9 = strlen(local_6f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," finalRes = ",0xc);
    if (0 < (int)local_720) {
      iVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_730,"sumIn",5);
        local_580[0] = (char)iVar5 + 'A';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_730,local_580,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," + ",3);
        iVar5 = iVar5 + 1;
      } while ((int)local_720 != iVar5);
    }
    poVar19 = local_730;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_730,"sumRes;\n",8);
  }
  else {
    iVar6 = glu::getDataTypeScalarSize(DVar7);
    if (0 < (int)local_720) {
      pcVar8 = (char *)0x0;
      do {
        iVar26 = glu::getDataTypeScalarSize(local_738->m_paramTypes[(long)pcVar8]);
        if (iVar26 < iVar6) {
          iVar26 = iVar6;
        }
        iVar6 = iVar26;
        pcVar8 = pcVar8 + 1;
      } while (local_680 != pcVar8);
    }
    DVar7 = TYPE_FLOAT;
    if (iVar6 != 1) {
      DVar7 = glu::getDataTypeFloatVec(iVar6);
    }
    pcVar8 = glu::getDataTypeName(DVar7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_580,pcVar8,(allocator<char> *)&local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
    pcVar8 = local_650;
    if (local_650 == (char *)0x0) {
      std::ios::clear(iVar5 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar9 = strlen(local_650);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01,(char *)local_580,local_578);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," finalRes = ",0xc);
    if (0 < (int)local_720) {
      iVar5 = 0;
      do {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_730,(char *)local_580,local_578);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(sumIn",6);
        local_6e0.name._M_dataplus._M_p._0_1_ = (char)iVar5 + 'A';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_6e0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") + ",4);
        iVar5 = iVar5 + 1;
      } while ((int)local_720 != iVar5);
    }
    poVar19 = local_730;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_730,(char *)local_580,local_578);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(sumRes);\n",10);
    if (local_580 != (undefined1  [8])local_570) {
      operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar19,"\tmediump vec4 color = ",0x16);
  if (DVar7 == TYPE_FLOAT_VEC4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,"finalRes",8);
  }
  else {
    if (local_759 == '\0') {
      iVar5 = glu::getDataTypeScalarSize(DVar7);
      local_788 = (char *)CONCAT44(local_788._4_4_,iVar5);
    }
    else {
      iVar5 = glu::getDataTypeMatrixNumRows(DVar7);
      local_788 = (char *)CONCAT44(local_788._4_4_,iVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,"vec4(",5);
    if (local_759 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,"finalRes",8);
    }
    else {
      for (iVar5 = 0; iVar6 = glu::getDataTypeMatrixNumColumns(DVar7), iVar5 < iVar6;
          iVar5 = iVar5 + 1) {
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19," + ",3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,"finalRes[",9);
        poVar10 = (ostream *)std::ostream::operator<<(poVar19,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
      }
    }
    poVar19 = local_730;
    if ((int)local_788 < 4) {
      iVar5 = 4 - (int)local_788;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,", ",2);
        pcVar8 = "0.0";
        if (iVar5 == 1) {
          pcVar8 = "1.0";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,pcVar8,3);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    poVar19 = local_730;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_730,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,"\t",1);
  pcVar8 = "o_color";
  if (local_728 == CASETYPE_VERTEX) {
    pcVar8 = "v_color";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19,pcVar8,7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar19," = color;\n",10);
  if (local_728 == CASETYPE_VERTEX) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tgl_Position = a_position + u_zero*color;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\to_color = v_color;\n",0x14);
  }
  else if (0 < (int)local_724) {
    uVar18 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_in",5);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = a_in",7);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      uVar18 = uVar18 + 1;
    } while (local_724 != uVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_718._0_8_ = (pointer)0x0;
  local_718._8_8_ = (pointer)0x0;
  local_718._16_8_ = (pointer)0x0;
  if (0 < (int)local_724) {
    uVar18 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
      std::ostream::operator<<((ostringstream *)local_580,uVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
      std::ios_base::~ios_base(local_510);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_758,0,(char *)0x0,0x1ceab5f);
      local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_780.field_2._M_allocated_capacity = *puVar16;
        local_780.field_2._8_8_ = plVar11[3];
      }
      else {
        local_780.field_2._M_allocated_capacity = *puVar16;
        local_780._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_780._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar23 = uVar18 + 5;
      if (-1 < (int)(uVar18 + 2)) {
        uVar23 = uVar18 + 2;
      }
      uVar24 = uVar18 + 6;
      if (-1 < (int)(uVar18 + 3)) {
        uVar24 = uVar18 + 3;
      }
      local_648.m_data[1] = (local_738->m_attribute).m_data[uVar18 & 3];
      local_648.m_data[2] = (local_738->m_attribute).m_data[uVar18 + 1 & 3];
      local_648.m_data[3] =
           (local_738->m_attribute).m_data[(int)((uVar18 - (uVar23 & 0xfffffffc)) + 2)];
      local_648.m_data[0] =
           (local_738->m_attribute).m_data[(int)((uVar18 - (uVar24 & 0xfffffffc)) + 3)];
      local_580._4_4_ = local_648.m_data[2];
      local_580._0_4_ = local_648.m_data[1];
      local_578 = CONCAT44(local_648.m_data[0],local_648.m_data[3]);
      local_670.m_data[1] = local_648.m_data[3];
      local_670.m_data[0] = local_648.m_data[2];
      local_670.m_data[3] = local_648.m_data[1];
      local_670.m_data[2] = local_648.m_data[0];
      local_628.m_data[1] = local_648.m_data[0];
      local_628.m_data[0] = local_648.m_data[3];
      local_628.m_data[3] = local_648.m_data[2];
      local_628.m_data[2] = local_648.m_data[1];
      OperatorPerformanceCase::AttribSpec::AttribSpec
                (&local_6e0,local_780._M_dataplus._M_p,(Vec4 *)local_580,&local_670,&local_628,
                 &local_648);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
      ::push_back((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                   *)local_718,&local_6e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
        operator_delete(local_6e0.name._M_dataplus._M_p,
                        local_6e0.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_dataplus._M_p != &local_780.field_2) {
        operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_758._M_dataplus._M_p != &local_758.field_2) {
        operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_724);
  }
  local_580 = (undefined1  [8])local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"This is the program ","");
  std::__cxx11::string::append(local_580);
  std::operator+(&local_780," \'",&local_738->m_func);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_780);
  local_6e0.name._M_dataplus._M_p = (pointer)&local_6e0.name.field_2;
  psVar15 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_6e0.name.field_2._M_allocated_capacity = *psVar15;
    local_6e0.name.field_2._8_8_ = plVar11[3];
  }
  else {
    local_6e0.name.field_2._M_allocated_capacity = *psVar15;
    local_6e0.name._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_6e0.name._M_string_length = plVar11[1];
  *plVar11 = (long)psVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::_M_append(local_580,(ulong)local_6e0.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
    operator_delete(local_6e0.name._M_dataplus._M_p,local_6e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  OperatorPerformanceCase::ProgramContext::ProgramContext
            (local_5c8,&local_6e0.name,&local_780,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
              *)local_718,(string *)local_580);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.name._M_dataplus._M_p != &local_6e0.name.field_2) {
    operator_delete(local_6e0.name._M_dataplus._M_p,local_6e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_580 != (undefined1  [8])local_570) {
    operator_delete((void *)local_580,local_570[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
             *)local_718);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  lVar17 = -0x60;
  plVar11 = local_348 + 2;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0);
  if (local_608 != &local_5f8) {
    operator_delete(local_608,local_5f8 + 1);
  }
  return local_5c8;
}

Assistant:

FunctionCase::ProgramContext FunctionCase::generateSingleProgramData (ProgramID programID) const
{
	const bool			isVertexCase			= m_caseType == CASETYPE_VERTEX;
	const char* const	precision				= glu::getPrecisionName(m_precision);
	const char* const	returnTypeName			= getDataTypeName(m_returnType);
	const string		returnPrecisionMaybe	= glu::isDataTypeBoolOrBVec(m_returnType) ? "" : string() + precision + " ";
	const char*			inputPrecision			= DE_NULL;
	const bool			isMatrixReturn			= isDataTypeMatrix(m_returnType);
	int					numParams				= 0;
	const char*			paramTypeNames[MAX_PARAMS];
	string				paramPrecisionsMaybe[MAX_PARAMS];

	for (int i = 0; i < MAX_PARAMS; i++)
	{
		paramTypeNames[i]			= getDataTypeName(m_paramTypes[i]);
		paramPrecisionsMaybe[i]		= glu::isDataTypeBoolOrBVec(m_paramTypes[i]) ? "" : string() + precision + " ";

		if (inputPrecision == DE_NULL && isDataTypeIntOrIVec(m_paramTypes[i]) && m_precision == glu::PRECISION_LOWP)
			inputPrecision = "mediump";

		if (m_paramTypes[i] != TYPE_INVALID)
			numParams = i+1;
	}

	DE_ASSERT(numParams > 0);

	if (inputPrecision == DE_NULL)
		inputPrecision = precision;

	int						numAttributes	= FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS + numParams - 1;
	std::ostringstream		vtx;
	std::ostringstream		frag;
	std::ostringstream&		op				= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n"
		 << "layout (location = 0) out mediump vec4 o_color;\n";

	// Attributes.
	vtx << "in highp vec4 a_position;\n";
	for (int i = 0; i < numAttributes; i++)
		vtx << "in " << inputPrecision << " vec4 a_in" << i << ";\n";

	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < numAttributes; i++)
		{
			vtx << "out " << inputPrecision << " vec4 v_in" << i << ";\n";
			frag << "in " << inputPrecision << " vec4 v_in" << i << ";\n";
		}
	}

	op << "uniform mediump int u_numLoopIterations;\n";
	if (isVertexCase)
		op << "uniform mediump float u_zero;\n";

	for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
		op << "uniform " << paramPrecisionsMaybe[paramNdx] << paramTypeNames[paramNdx] << " u_inc" << (char)('A'+paramNdx) << ";\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";

	if (!isVertexCase)
		vtx << "\tgl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Function call input and return value accumulation variables.
	{
		const char* const inPrefix = isVertexCase ? "a_" : "v_";

		for (int calcNdx = 0; calcNdx < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; calcNdx++)
		{
			for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
			{
				const glu::DataType		paramType	= m_paramTypes[paramNdx];
				const bool				mustCast	= paramType != glu::TYPE_FLOAT_VEC4;

				op << "\t" << paramPrecisionsMaybe[paramNdx] << paramTypeNames[paramNdx] << " in" << calcNdx << (char)('a'+paramNdx) << " = ";

				if (mustCast)
					op << paramTypeNames[paramNdx] << "(";

				if (glu::isDataTypeMatrix(paramType))
				{
					static const char* const	swizzles[3]		= { "x", "xy", "xyz" };
					const int					numRows			= glu::getDataTypeMatrixNumRows(paramType);
					const int					numCols			= glu::getDataTypeMatrixNumColumns(paramType);
					const string				swizzle			= numRows < 4 ? string() + "." + swizzles[numRows-1] : "";

					for (int i = 0; i < numCols; i++)
						op << (i > 0 ? ", " : "") << inPrefix << "in" << calcNdx+paramNdx << swizzle;
				}
				else
				{
					op << inPrefix << "in" << calcNdx+paramNdx;

					if (paramNdx == m_modifyParamNdx)
					{
						DE_ASSERT(glu::isDataTypeFloatOrVec(paramType));
						op << " + 2.0";
					}
				}

				if (mustCast)
					op << ")";

				op << ";\n";
			}

			op << "\t" << returnPrecisionMaybe << returnTypeName << " res" << calcNdx << " = " << returnTypeName << "(0);\n";
		}
	}

	// Loop with expressions in it.
	op << "\tfor (int i = 0; i < u_numLoopIterations; i++)\n";
	op << "\t{\n";
	for (int calcNdx = 0; calcNdx < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; calcNdx++)
	{
		if (calcNdx > 0)
			op << "\n";

		op << "\t\t{\n";

		for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
		{
			const string inputName	= "in" + de::toString(calcNdx) + (char)('a'+inputNdx);
			const string incName	= string() + "u_inc" + (char)('A'+inputNdx);
			const string incExpr	= incrementExpr(incName, m_paramTypes[inputNdx], m_useNearlyConstantInputs);

			op << "\t\t\t" << inputName << " = " << sumExpr(inputName, incExpr, m_paramTypes[inputNdx]) << ";\n";
		}

		op << "\t\t\t" << returnPrecisionMaybe << returnTypeName << " eval" << calcNdx << " = ";

		if (programID == PROGRAM_WITH_FUNCTION_CALLS)
		{
			op << m_func << "(";

			for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
			{
				if (paramNdx > 0)
					op << ", ";

				op << "in" << calcNdx << (char)('a'+paramNdx);
			}

			op << ")";
		}
		else
		{
			DE_ASSERT(programID == PROGRAM_WITHOUT_FUNCTION_CALLS);
			op << returnTypeName << "(1)";
		}

		op << ";\n";

		{
			const string resName	= "res" + de::toString(calcNdx);
			const string evalName	= "eval" + de::toString(calcNdx);
			const string incExpr	= incrementExpr(evalName, m_returnType, m_useNearlyConstantInputs);

			op << "\t\t\tres" << calcNdx << " = " << sumExpr(resName, incExpr, m_returnType) << ";\n";
		}

		op << "\t\t}\n";
	}
	op << "\t}\n";
	op << "\n";

	// Result variables.
	for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
	{
		op << "\t" << paramPrecisionsMaybe[inputNdx] << paramTypeNames[inputNdx] << " sumIn" << (char)('A'+inputNdx) << " = ";
		{
			string expr = string() + "in0" + (char)('a'+inputNdx);
			for (int i = 1; i < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; i++)
				expr = sumExpr(expr, string() + "in" + de::toString(i) + (char)('a'+inputNdx), m_paramTypes[inputNdx]);
			op << expr;
		}
		op << ";\n";
	}

	op << "\t" << returnPrecisionMaybe << returnTypeName << " sumRes = ";
	{
		string expr = "res0";
		for (int i = 1; i < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; i++)
			expr = sumExpr(expr, "res" + de::toString(i), m_returnType);
		op << expr;
	}
	op << ";\n";

	{
		glu::DataType finalResultDataType = glu::TYPE_LAST;

		if (glu::isDataTypeMatrix(m_returnType))
		{
			finalResultDataType = m_returnType;

			op << "\t" << precision << " " << returnTypeName << " finalRes = ";

			for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
			{
				DE_ASSERT(m_paramTypes[inputNdx] == m_returnType);
				op << "sumIn" << (char)('A'+inputNdx) << " + ";
			}
			op << "sumRes;\n";
		}
		else
		{
			int numFinalResComponents = glu::getDataTypeScalarSize(m_returnType);
			for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
				numFinalResComponents = de::max(numFinalResComponents, glu::getDataTypeScalarSize(m_paramTypes[inputNdx]));

			finalResultDataType = getDataTypeFloatOrVec(numFinalResComponents);

			{
				const string finalResType = glu::getDataTypeName(finalResultDataType);
				op << "\t" << precision << " " << finalResType << " finalRes = ";
				for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
					op << finalResType << "(sumIn" << (char)('A'+inputNdx) << ") + ";
				op << finalResType << "(sumRes);\n";
			}
		}

		// Convert to color.
		op << "\tmediump vec4 color = ";
		if (finalResultDataType == TYPE_FLOAT_VEC4)
			op << "finalRes";
		else
		{
			int size = isMatrixReturn ? getDataTypeMatrixNumRows(finalResultDataType) : getDataTypeScalarSize(finalResultDataType);

			op << "vec4(";

			if (isMatrixReturn)
			{
				for (int i = 0; i < getDataTypeMatrixNumColumns(finalResultDataType); i++)
				{
					if (i > 0)
						op << " + ";
					op << "finalRes[" << i << "]";
				}
			}
			else
				op << "finalRes";

			for (int i = size; i < 4; i++)
				op << ", " << (i == 3 ? "1.0" : "0.0");

			op << ")";
		}
		op << ";\n";
		op << "\t" << (isVertexCase ? "v_color" : "o_color") << " = color;\n";

		if (isVertexCase)
		{
			vtx << "	gl_Position = a_position + u_zero*color;\n";
			frag << "	o_color = v_color;\n";
		}
		else
		{
			for (int i = 0; i < numAttributes; i++)
				vtx << "	v_in" << i << " = a_in" << i << ";\n";
		}

		vtx << "}\n";
		frag << "}\n";
	}

	{
		vector<AttribSpec> attributes;
		for (int i = 0; i < numAttributes; i++)
			attributes.push_back(AttribSpec(("a_in" + de::toString(i)).c_str(),
											m_attribute.swizzle((i+0)%4, (i+1)%4, (i+2)%4, (i+3)%4),
											m_attribute.swizzle((i+1)%4, (i+2)%4, (i+3)%4, (i+0)%4),
											m_attribute.swizzle((i+2)%4, (i+3)%4, (i+0)%4, (i+1)%4),
											m_attribute.swizzle((i+3)%4, (i+0)%4, (i+1)%4, (i+2)%4)));

		{
			string description = "This is the program ";

			description += programID == PROGRAM_WITHOUT_FUNCTION_CALLS	? "without"
						 : programID == PROGRAM_WITH_FUNCTION_CALLS		? "with"
						 : DE_NULL;

			description += " '" + m_func + "' function calls.\n"
						   "Note: workload size for this program means the number of loop iterations.";

			return ProgramContext(vtx.str(), frag.str(), attributes, description);
		}
	}
}